

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

uint32_t ssl_get_hs_frag_len(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  
  puVar1 = ssl->in_msg;
  return (uint)puVar1[0xb] | (uint)puVar1[10] << 8 | (uint)puVar1[9] << 0x10;
}

Assistant:

static uint32_t ssl_get_hs_frag_len(mbedtls_ssl_context const *ssl)
{
    return (ssl->in_msg[9] << 16) |
           (ssl->in_msg[10] << 8) |
           ssl->in_msg[11];
}